

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O0

void screenshot_term_query(wchar_t wid,wchar_t hgt,wchar_t x,wchar_t y,int *a,wchar_t *c)

{
  wchar_t x_00;
  wchar_t y_00;
  wchar_t srcy;
  wchar_t srcx;
  wchar_t *c_local;
  int *a_local;
  wchar_t y_local;
  wchar_t x_local;
  wchar_t hgt_local;
  wchar_t wid_local;
  
  if (((y < row_top_map[Term->sidebar_mode]) || (hgt - row_bottom_map[Term->sidebar_mode] <= y)) ||
     (x < col_map[Term->sidebar_mode])) {
    Term_what(x,y,a,c);
  }
  else {
    x_00 = (x - col_map[Term->sidebar_mode]) * (uint)tile_width + col_map[Term->sidebar_mode];
    y_00 = (y - row_top_map[Term->sidebar_mode]) * (uint)tile_height +
           row_top_map[Term->sidebar_mode];
    if ((x_00 < wid) && (y_00 < hgt - row_bottom_map[Term->sidebar_mode])) {
      Term_what(x_00,y_00,a,c);
    }
    else {
      *a = 1;
      *c = L' ';
    }
  }
  return;
}

Assistant:

static void screenshot_term_query(int wid, int hgt, int x, int y, int *a, wchar_t *c)
{
	if (y < ROW_MAP || y >= hgt - ROW_BOTTOM_MAP || x < COL_MAP) {
		/* Record everything outside the map. */
		(void) Term_what(x, y, a, c);
	} else {
		/*
		 * In the map, skip over the padding for scaled up tiles.  As
		 * necessary, pad trailing columns and rows with blanks.
		 */
		int srcx = (x - COL_MAP) * tile_width + COL_MAP;
		int srcy = (y - ROW_MAP) * tile_height + ROW_MAP;

		if (srcx < wid && srcy < hgt - ROW_BOTTOM_MAP) {
			(void) Term_what(srcx, srcy, a, c);
		} else {
			*a = COLOUR_WHITE;
			*c = ' ';
		}
	}
}